

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::anon_unknown_0::EncodeResult<double>
          (anon_unknown_0 *this,CalculatedFloat *calculated,bool negative,
          Nonnull<absl::from_chars_result_*> result,Nonnull<double_*> value)

{
  long lVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = (int)calculated;
  if (iVar2 == 99999) {
    result->ec = result_out_of_range;
    if (negative) {
      dVar3 = -1.79769313486232e+308;
    }
    else {
      dVar3 = 1.79769313486232e+308;
    }
  }
  else {
    if (this != (anon_unknown_0 *)0x0 && iVar2 != -99999) {
      lVar1 = (ulong)negative << 0x3f;
      if ((ulong)this >> 0x34 == 0) {
        if (iVar2 != -0x432) {
          __assert_fail("exponent == kMinNormalExponent",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/charconv.cc"
                        ,0xaa,
                        "static double absl::lts_20250127::(anonymous namespace)::FloatTraits<double>::Make(mantissa_t, int, bool)"
                       );
        }
      }
      else {
        lVar1 = lVar1 + ((ulong)(iVar2 + 0x433) << 0x34);
        this = (anon_unknown_0 *)((ulong)this & 0xfffffffffffff);
      }
      *value = (double)(this + lVar1);
      return;
    }
    result->ec = result_out_of_range;
    if (negative) {
      dVar3 = -0.0;
    }
    else {
      dVar3 = 0.0;
    }
  }
  *value = dVar3;
  return;
}

Assistant:

void EncodeResult(const CalculatedFloat& calculated, bool negative,
                  absl::Nonnull<absl::from_chars_result*> result,
                  absl::Nonnull<FloatType*> value) {
  if (calculated.exponent == kOverflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    return;
  } else if (calculated.mantissa == 0 || calculated.exponent == kUnderflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -0.0 : 0.0;
    return;
  }
  *value = FloatTraits<FloatType>::Make(
      static_cast<typename FloatTraits<FloatType>::mantissa_t>(
          calculated.mantissa),
      calculated.exponent, negative);
}